

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specwriter.cpp
# Opt level: O0

bool __thiscall
apngasm::spec::SpecWriter::writeJSON(SpecWriter *this,string *filePath,string *imageDir)

{
  ssize_t sVar1;
  size_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  undefined1 local_40 [8];
  JSONSpecWriterImpl impl;
  string *imageDir_local;
  string *filePath_local;
  SpecWriter *this_local;
  
  if (this->_pApngasm == (APNGAsm *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    impl.super_AbstractSpecWriterImpl._pListener = (IAPNGAsmListener *)imageDir;
    priv::JSONSpecWriterImpl::JSONSpecWriterImpl
              ((JSONSpecWriterImpl *)local_40,this->_pApngasm,this->_pListener);
    std::operator+(&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   impl.super_AbstractSpecWriterImpl._pListener,'/');
    anon_unknown_0::createRelativeDir(&local_60,filePath,&local_80);
    sVar1 = priv::JSONSpecWriterImpl::write
                      ((JSONSpecWriterImpl *)local_40,(int)filePath,&local_60,in_RCX);
    this_local._7_1_ = (bool)((byte)sVar1 & 1);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    priv::JSONSpecWriterImpl::~JSONSpecWriterImpl((JSONSpecWriterImpl *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool SpecWriter::writeJSON(const std::string& filePath, const std::string& imageDir) const
    {
      if (!_pApngasm)
        return false;

      priv::JSONSpecWriterImpl impl(_pApngasm, _pListener);
      return impl.write(filePath, createRelativeDir(filePath, imageDir + separator));
    }